

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_parse_url_path(Curl_easy *data)

{
  char cVar1;
  size_t sVar2;
  int iVar3;
  void *pvVar4;
  char *pcVar5;
  size_t sVar6;
  size_t local_b0;
  char *local_a8;
  size_t local_98;
  size_t n;
  char *oldPath;
  char *comp;
  size_t compLen;
  char *str;
  char *pcStack_68;
  int dirAlloc;
  char *curPos;
  size_t dirlen;
  size_t pathLen;
  char *rawPath;
  char *pcStack_40;
  CURLcode result;
  char *fileName;
  char *slashPos;
  ftp_conn *ftpc;
  connectdata *conn;
  FTP *ftp;
  Curl_easy *data_local;
  
  conn = (connectdata *)(data->req).p.file;
  ftpc = (ftp_conn *)data->conn;
  slashPos = (char *)&((connectdata *)ftpc)->proto;
  fileName = (char *)0x0;
  pcStack_40 = (char *)0x0;
  rawPath._4_4_ = 0;
  pathLen = 0;
  dirlen = 0;
  (((connectdata *)ftpc)->proto).ftpc.ctl_valid = false;
  (((connectdata *)ftpc)->proto).ftpc.cwdfail = false;
  ftp = (FTP *)data;
  rawPath._4_4_ = Curl_urldecode(*(char **)&conn->cnnct,0,(char **)&pathLen,&dirlen,REJECT_CTRL);
  if (rawPath._4_4_ != CURLE_OK) {
    Curl_failf((Curl_easy *)ftp,"path contains control characters");
    return rawPath._4_4_;
  }
  cVar1 = (char)ftp[0x37].downloadsize;
  if (cVar1 != '\x01') {
    if (cVar1 == '\x02') {
      if ((dirlen != 0) && (*(char *)(pathLen + (dirlen - 1)) != '/')) {
        pcStack_40 = (char *)pathLen;
      }
      goto LAB_00ab5230;
    }
    if (cVar1 == '\x03') {
      fileName = strrchr((char *)pathLen,0x2f);
      if (fileName == (char *)0x0) {
        pcStack_40 = (char *)pathLen;
      }
      else {
        curPos = fileName + -pathLen;
        if (curPos == (char *)0x0) {
          curPos = (char *)0x1;
        }
        pvVar4 = (*Curl_ccalloc)(1,8);
        *(void **)(slashPos + 0x98) = pvVar4;
        if (*(long *)(slashPos + 0x98) == 0) {
          (*Curl_cfree)((void *)pathLen);
          return CURLE_OUT_OF_MEMORY;
        }
        pvVar4 = (*Curl_ccalloc)(1,(size_t)(curPos + 1));
        **(undefined8 **)(slashPos + 0x98) = pvVar4;
        if (**(long **)(slashPos + 0x98) == 0) {
          (*Curl_cfree)((void *)pathLen);
          return CURLE_OUT_OF_MEMORY;
        }
        strncpy((char *)**(undefined8 **)(slashPos + 0x98),(char *)pathLen,(size_t)curPos);
        slashPos[0xa0] = '\x01';
        slashPos[0xa1] = '\0';
        slashPos[0xa2] = '\0';
        slashPos[0xa3] = '\0';
        pcStack_40 = fileName + 1;
      }
      goto LAB_00ab5230;
    }
  }
  pcStack_68 = (char *)pathLen;
  str._4_4_ = 0;
  for (compLen = pathLen; *(char *)compLen != '\0'; compLen = compLen + 1) {
    if (*(char *)compLen == '/') {
      str._4_4_ = str._4_4_ + 1;
    }
  }
  if (0 < str._4_4_) {
    pvVar4 = (*Curl_ccalloc)((long)str._4_4_,8);
    *(void **)(slashPos + 0x98) = pvVar4;
    if (*(long *)(slashPos + 0x98) == 0) {
      (*Curl_cfree)((void *)pathLen);
      return CURLE_OUT_OF_MEMORY;
    }
    while (fileName = strchr(pcStack_68,0x2f), fileName != (char *)0x0) {
      comp = fileName + -(long)pcStack_68;
      if ((comp == (char *)0x0) && (*(int *)(slashPos + 0xa0) == 0)) {
        comp = (char *)0x1;
      }
      if (comp != (char *)0x0) {
        pcVar5 = (char *)(*Curl_ccalloc)(1,(size_t)(comp + 1));
        if (pcVar5 == (char *)0x0) {
          (*Curl_cfree)((void *)pathLen);
          return CURLE_OUT_OF_MEMORY;
        }
        strncpy(pcVar5,pcStack_68,(size_t)comp);
        iVar3 = *(int *)(slashPos + 0xa0);
        *(int *)(slashPos + 0xa0) = iVar3 + 1;
        *(char **)(*(long *)(slashPos + 0x98) + (long)iVar3 * 8) = pcVar5;
      }
      pcStack_68 = fileName + 1;
    }
    fileName = (char *)0x0;
  }
  pcStack_40 = pcStack_68;
LAB_00ab5230:
  if ((pcStack_40 == (char *)0x0) || (*pcStack_40 == '\0')) {
    slashPos[0x90] = '\0';
    slashPos[0x91] = '\0';
    slashPos[0x92] = '\0';
    slashPos[0x93] = '\0';
    slashPos[0x94] = '\0';
    slashPos[0x95] = '\0';
    slashPos[0x96] = '\0';
    slashPos[0x97] = '\0';
  }
  else {
    pcVar5 = (*Curl_cstrdup)(pcStack_40);
    *(char **)(slashPos + 0x90) = pcVar5;
  }
  sVar2 = dirlen;
  if ((((*(ulong *)((long)&ftp[0x54].transfer + 2) >> 0x1a & 1) == 0) ||
      (*(long *)(slashPos + 0x90) != 0)) || (*(int *)&(conn->cnnct).outp != 0)) {
    slashPos[0xa6] = '\0';
    if (((char)ftp[0x37].downloadsize == '\x02') && (*(char *)pathLen == '/')) {
      slashPos[0xa6] = '\x01';
    }
    else {
      if ((*(uint *)((long)&ftpc[3].entrypath + 4) >> 7 & 1) == 0) {
        local_a8 = "";
      }
      else {
        local_a8 = *(char **)(slashPos + 0xb8);
      }
      if (local_a8 != (char *)0x0) {
        if ((char)ftp[0x37].downloadsize == '\x02') {
          local_98 = 0;
        }
        else {
          if (*(long *)(slashPos + 0x90) == 0) {
            local_b0 = 0;
          }
          else {
            local_b0 = strlen(*(char **)(slashPos + 0x90));
          }
          local_98 = sVar2 - local_b0;
        }
        sVar6 = strlen(local_a8);
        if ((sVar6 == local_98) && (iVar3 = strncmp((char *)pathLen,local_a8,local_98), iVar3 == 0))
        {
          Curl_infof((Curl_easy *)ftp,"Request has same path as previous transfer");
          slashPos[0xa6] = '\x01';
        }
      }
    }
    (*Curl_cfree)((void *)pathLen);
    data_local._4_4_ = CURLE_OK;
  }
  else {
    Curl_failf((Curl_easy *)ftp,"Uploading to a URL without a file name");
    (*Curl_cfree)((void *)pathLen);
    data_local._4_4_ = CURLE_URL_MALFORMAT;
  }
  return data_local._4_4_;
}

Assistant:

static
CURLcode ftp_parse_url_path(struct Curl_easy *data)
{
  /* the ftp struct is already inited in ftp_connect() */
  struct FTP *ftp = data->req.p.ftp;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  const char *slashPos = NULL;
  const char *fileName = NULL;
  CURLcode result = CURLE_OK;
  char *rawPath = NULL; /* url-decoded "raw" path */
  size_t pathLen = 0;

  ftpc->ctl_valid = FALSE;
  ftpc->cwdfail = FALSE;

  /* url-decode ftp path before further evaluation */
  result = Curl_urldecode(ftp->path, 0, &rawPath, &pathLen, REJECT_CTRL);
  if(result) {
    failf(data, "path contains control characters");
    return result;
  }

  switch(data->set.ftp_filemethod) {
    case FTPFILE_NOCWD: /* fastest, but less standard-compliant */

      if((pathLen > 0) && (rawPath[pathLen - 1] != '/'))
          fileName = rawPath;  /* this is a full file path */
      /*
        else: ftpc->file is not used anywhere other than for operations on
              a file. In other words, never for directory operations.
              So we can safely leave filename as NULL here and use it as a
              argument in dir/file decisions.
      */
      break;

    case FTPFILE_SINGLECWD:
      slashPos = strrchr(rawPath, '/');
      if(slashPos) {
        /* get path before last slash, except for / */
        size_t dirlen = slashPos - rawPath;
        if(dirlen == 0)
            dirlen++;

        ftpc->dirs = calloc(1, sizeof(ftpc->dirs[0]));
        if(!ftpc->dirs) {
          free(rawPath);
          return CURLE_OUT_OF_MEMORY;
        }

        ftpc->dirs[0] = calloc(1, dirlen + 1);
        if(!ftpc->dirs[0]) {
          free(rawPath);
          return CURLE_OUT_OF_MEMORY;
        }

        strncpy(ftpc->dirs[0], rawPath, dirlen);
        ftpc->dirdepth = 1; /* we consider it to be a single dir */
        fileName = slashPos + 1; /* rest is file name */
      }
      else
        fileName = rawPath; /* file name only (or empty) */
      break;

    default: /* allow pretty much anything */
    case FTPFILE_MULTICWD: {
      /* current position: begin of next path component */
      const char *curPos = rawPath;

      int dirAlloc = 0; /* number of entries allocated for the 'dirs' array */
      const char *str = rawPath;
      for(; *str != 0; ++str)
        if (*str == '/')
          ++dirAlloc;

      if(dirAlloc > 0) {
        ftpc->dirs = calloc(dirAlloc, sizeof(ftpc->dirs[0]));
        if(!ftpc->dirs) {
          free(rawPath);
          return CURLE_OUT_OF_MEMORY;
        }

        /* parse the URL path into separate path components */
        while((slashPos = strchr(curPos, '/'))) {
          size_t compLen = slashPos - curPos;

          /* path starts with a slash: add that as a directory */
          if((compLen == 0) && (ftpc->dirdepth == 0))
            ++compLen;

          /* we skip empty path components, like "x//y" since the FTP command
             CWD requires a parameter and a non-existent parameter a) doesn't
             work on many servers and b) has no effect on the others. */
          if(compLen > 0) {
            char *comp = calloc(1, compLen + 1);
            if(!comp) {
              free(rawPath);
              return CURLE_OUT_OF_MEMORY;
            }
            strncpy(comp, curPos, compLen);
            ftpc->dirs[ftpc->dirdepth++] = comp;
          }
          curPos = slashPos + 1;
        }
      }
      DEBUGASSERT(ftpc->dirdepth <= dirAlloc);
      fileName = curPos; /* the rest is the file name (or empty) */
    }
    break;
  } /* switch */

  if(fileName && *fileName)
    ftpc->file = strdup(fileName);
  else
    ftpc->file = NULL; /* instead of point to a zero byte,
                            we make it a NULL pointer */

  if(data->set.upload && !ftpc->file && (ftp->transfer == PPTRANSFER_BODY)) {
    /* We need a file name when uploading. Return error! */
    failf(data, "Uploading to a URL without a file name");
    free(rawPath);
    return CURLE_URL_MALFORMAT;
  }

  ftpc->cwddone = FALSE; /* default to not done */

  if((data->set.ftp_filemethod == FTPFILE_NOCWD) && (rawPath[0] == '/'))
    ftpc->cwddone = TRUE; /* skip CWD for absolute paths */
  else { /* newly created FTP connections are already in entry path */
    const char *oldPath = conn->bits.reuse ? ftpc->prevpath : "";
    if(oldPath) {
      size_t n = pathLen;
      if(data->set.ftp_filemethod == FTPFILE_NOCWD)
        n = 0; /* CWD to entry for relative paths */
      else
        n -= ftpc->file?strlen(ftpc->file):0;

      if((strlen(oldPath) == n) && !strncmp(rawPath, oldPath, n)) {
        infof(data, "Request has same path as previous transfer");
        ftpc->cwddone = TRUE;
      }
    }
  }

  free(rawPath);
  return CURLE_OK;
}